

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O2

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  int *piVar1;
  long *plVar2;
  curl_socket_t sockfd;
  Curl_easy *data;
  bool bVar3;
  byte bVar4;
  _Bool _Var5;
  anon_enum_32 aVar6;
  CURLcode CVar7;
  CURLcode CVar8;
  int iVar9;
  CHUNKcode CVar10;
  char *pcVar11;
  Curl_send_buffer *buff;
  char *pcVar12;
  char *pcVar13;
  time_t tVar14;
  ulong timeout_ms;
  long lVar15;
  undefined8 extraout_RAX;
  char *pcVar16;
  char *pcVar17;
  ulong uVar18;
  uint uVar19;
  char *pcVar20;
  char *pcVar21;
  bool bVar22;
  size_t len;
  char cVar23;
  char *local_a0;
  long local_78;
  int local_6c;
  int subversion;
  ulong local_58;
  char *local_50;
  ssize_t gotbytes;
  long *local_40;
  ssize_t local_38;
  
  aVar6 = conn->tunnel_state[sockindex];
  local_50 = hostname;
  if ((aVar6 == TUNNEL_INIT) && (aVar6 = TUNNEL_INIT, conn->connect_buffer == (char *)0x0)) {
    pcVar11 = (char *)(*Curl_cmalloc)(0x4000);
    conn->connect_buffer = pcVar11;
    if (pcVar11 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    aVar6 = conn->tunnel_state[sockindex];
  }
  subversion = 0;
  if (aVar6 == TUNNEL_COMPLETE) {
LAB_0012a890:
    CVar8 = CURLE_OK;
    CVar7 = CURLE_OK;
    if (conn->tunnel_state[sockindex] == TUNNEL_COMPLETE) {
LAB_0012b24e:
      CVar8 = CVar7;
      (*Curl_cfree)(conn->connect_buffer);
      conn->connect_buffer = (char *)0x0;
    }
    return CVar8;
  }
  data = conn->data;
  sockfd = conn->sock[sockindex];
  (conn->bits).proxy_connect_closed = false;
  local_40 = &(data->info).request_size;
  piVar1 = &(data->req).httpcode;
  local_58 = 0;
  local_78 = 0;
LAB_0012a8f1:
  pcVar11 = local_50;
  if (aVar6 != TUNNEL_INIT) {
LAB_0012ab79:
    tVar14 = Curl_timeleft(data,(timeval *)0x0,true);
    if (0 < tVar14) goto code_r0x0012ab8f;
    Curl_failf(data,"Proxy CONNECT aborted due to timeout");
LAB_0012b3bb:
    CVar7 = CURLE_RECV_ERROR;
    goto LAB_0012b24e;
  }
  Curl_infof(data,"Establish HTTP proxy tunnel to %s:%hu\n",local_50,(ulong)(uint)remote_port);
  (*Curl_cfree)((data->req).newurl);
  (data->req).newurl = (char *)0x0;
  buff = Curl_add_buffer_init();
  if (buff != (Curl_send_buffer *)0x0) {
    pcVar11 = curl_maprintf("%s:%hu",pcVar11,(ulong)(uint)remote_port);
    if (pcVar11 != (char *)0x0) {
      CVar7 = Curl_http_output_auth(conn,"CONNECT",pcVar11,true);
      (*Curl_cfree)(pcVar11);
      pcVar11 = local_50;
      if (CVar7 == CURLE_OK) {
        pcVar16 = "1.1";
        if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
          pcVar16 = "1.0";
        }
        if ((conn->host).name == local_50) {
          cVar23 = (conn->bits).ipv6_ip;
        }
        else {
          pcVar12 = strchr(local_50,0x3a);
          cVar23 = pcVar12 != (char *)0x0;
        }
        pcVar17 = "";
        pcVar12 = "";
        if (cVar23 != '\0') {
          pcVar12 = "[";
          pcVar17 = "]";
        }
        pcVar11 = curl_maprintf("%s%s%s:%hu",pcVar12,pcVar11,pcVar17,(ulong)(uint)remote_port);
        if (pcVar11 == (char *)0x0) goto LAB_0012b3d7;
        pcVar12 = Curl_checkProxyheaders(conn,"Host:");
        if (pcVar12 == (char *)0x0) {
          pcVar12 = curl_maprintf("Host: %s\r\n",pcVar11);
          if (pcVar12 == (char *)0x0) {
            (*Curl_cfree)(pcVar11);
            goto LAB_0012b3d7;
          }
        }
        else {
          pcVar12 = (char *)0x0;
        }
        pcVar17 = Curl_checkProxyheaders(conn,"Proxy-Connection:");
        pcVar20 = "";
        if (pcVar17 == (char *)0x0) {
          pcVar20 = "Proxy-Connection: Keep-Alive\r\n";
        }
        pcVar13 = Curl_checkProxyheaders(conn,"User-Agent:");
        pcVar17 = "";
        if ((pcVar13 == (char *)0x0) && (pcVar17 = "", (data->set).str[0x24] != (char *)0x0)) {
          pcVar17 = (conn->allocptr).uagent;
        }
        pcVar13 = pcVar12;
        if (pcVar12 == (char *)0x0) {
          pcVar13 = "";
        }
        pcVar21 = (conn->allocptr).proxyuserpwd;
        if (pcVar21 == (char *)0x0) {
          pcVar21 = "";
        }
        CVar8 = Curl_add_bufferf(buff,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar11,pcVar16,pcVar13,
                                 pcVar21,pcVar17,pcVar20);
        if (pcVar12 != (char *)0x0) {
          (*Curl_cfree)(pcVar12);
        }
        (*Curl_cfree)(pcVar11);
        if (((CVar8 == CURLE_OK) &&
            (CVar8 = Curl_add_custom_headers(conn,true,buff), CVar8 == CURLE_OK)) &&
           (CVar8 = Curl_add_bufferf(buff,"\r\n"), CVar8 == CURLE_OK)) {
          CVar8 = Curl_add_buffer_send(buff,conn,local_40,0,sockindex);
          buff = (Curl_send_buffer *)0x0;
          CVar7 = CURLE_OK;
          if (CVar8 == CURLE_OK) goto LAB_0012ab58;
        }
        Curl_failf(data,"Failed sending CONNECT to proxy");
        buff = (Curl_send_buffer *)0x0;
        CVar7 = CVar8;
      }
LAB_0012ab58:
      Curl_add_buffer_free(buff);
      if (CVar7 == CURLE_OK) {
        conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
        goto LAB_0012ab79;
      }
      goto LAB_0012b24e;
    }
LAB_0012b3d7:
    Curl_add_buffer_free(buff);
  }
  CVar7 = CURLE_OUT_OF_MEMORY;
  goto LAB_0012b24e;
code_r0x0012ab8f:
  _Var5 = Curl_conn_data_pending(conn,sockindex);
  if (_Var5) {
    uVar18 = 0;
    bVar3 = false;
LAB_0012abab:
    do {
      bVar22 = bVar3;
      pcVar11 = conn->connect_buffer;
      local_6c = 0;
      uVar19 = 1;
      local_a0 = pcVar11;
LAB_0012abca:
      bVar3 = false;
      if ((0x3fff < uVar18) || (uVar19 == 0)) {
LAB_0012b10f:
        iVar9 = Curl_pgrsUpdate(conn);
        if ((bVar3) || (iVar9 != 0)) {
          CVar7 = CURLE_RECV_ERROR;
          if (iVar9 != 0) {
            CVar7 = CURLE_ABORTED_BY_CALLBACK;
          }
          goto LAB_0012b24e;
        }
        if ((data->info).httpproxycode == 200) {
          pcVar11 = (data->req).newurl;
          if (!bVar22) goto LAB_0012b17c;
LAB_0012b2a1:
          if (pcVar11 != (char *)0x0) {
            Curl_closesocket(conn,conn->sock[sockindex]);
            conn->sock[sockindex] = -1;
          }
          bVar4 = 1;
        }
        else {
          CVar7 = Curl_http_auth_act(conn);
          if (CVar7 != CURLE_OK) goto LAB_0012b24e;
          pcVar11 = (data->req).newurl;
          if (bVar22 || ((conn->bits).close & 1U) != 0) goto LAB_0012b2a1;
LAB_0012b17c:
          if (pcVar11 == (char *)0x0) {
            bVar4 = 0;
          }
          else {
            aVar6 = conn->tunnel_state[sockindex];
            if (aVar6 != TUNNEL_COMPLETE) goto LAB_0012a8f1;
            conn->tunnel_state[sockindex] = TUNNEL_INIT;
            bVar4 = 0;
            Curl_infof(data,"TUNNEL_STATE switched to: %d\n",0);
            if ((data->req).newurl != (char *)0x0) {
              aVar6 = conn->tunnel_state[sockindex];
              goto LAB_0012a8f1;
            }
          }
        }
        if (*piVar1 == 200) {
          conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
          (*Curl_cfree)((conn->allocptr).proxyuserpwd);
          (conn->allocptr).proxyuserpwd = (char *)0x0;
          (data->state).authproxy.done = true;
          Curl_infof(data,"Proxy replied OK to CONNECT request\n");
          (data->req).ignorebody = false;
          (conn->bits).rewindaftersend = false;
          break;
        }
        pcVar11 = (data->req).newurl;
        if ((bool)(bVar4 & pcVar11 != (char *)0x0)) {
          (conn->bits).proxy_connect_closed = true;
          Curl_infof(data,"Connect me again please\n");
        }
        else {
          (*Curl_cfree)(pcVar11);
          (data->req).newurl = (char *)0x0;
          Curl_conncontrol(conn,2);
          Curl_closesocket(conn,conn->sock[sockindex]);
          conn->sock[sockindex] = -1;
        }
        conn->tunnel_state[sockindex] = TUNNEL_INIT;
        if ((conn->bits).proxy_connect_closed == true) {
          return CURLE_OK;
        }
        Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                   (ulong)(uint)(data->req).httpcode);
        goto LAB_0012b3bb;
      }
LAB_0012abe9:
      iVar9 = Curl_pgrsUpdate(conn);
      if (iVar9 != 0) {
        CVar7 = CURLE_ABORTED_BY_CALLBACK;
        goto LAB_0012b24e;
      }
      if (conn->connect_buffer + 0x4000 <= pcVar11) {
        Curl_failf(data,"CONNECT response too large!");
        CVar7 = CURLE_RECV_ERROR;
        goto LAB_0012b24e;
      }
      timeout_ms = Curl_timeleft(data,(timeval *)0x0,true);
      if ((long)timeout_ms < 1) {
        pcVar11 = "Proxy CONNECT aborted due to timeout";
        goto LAB_0012b100;
      }
      CVar7 = Curl_read(conn,sockfd,pcVar11,1,&gotbytes);
      if (CVar7 == CURLE_AGAIN) goto code_r0x0012ac48;
      if (CVar7 != CURLE_OK) {
        bVar3 = false;
        goto LAB_0012b10f;
      }
      if (gotbytes < 1) {
        if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
          Curl_failf(data,"Proxy CONNECT aborted");
          bVar3 = true;
        }
        else {
          (conn->bits).proxy_connect_closed = true;
          bVar3 = false;
          Curl_infof(data,"Proxy CONNECT connection closed\n");
        }
        goto LAB_0012b10f;
      }
      if (1 < uVar19) {
        pcVar11 = conn->connect_buffer;
        if (local_78 == 0) {
          local_38 = 0;
          CVar10 = Curl_httpchunk_read(conn,pcVar11,1,&local_38);
          uVar19 = 2;
          if (CVar10 == CHUNKE_STOP) {
            Curl_infof(data,"chunk reading DONE\n");
            uVar19 = 0;
            conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
          }
          uVar18 = 0;
          local_78 = 0;
        }
        else {
          lVar15 = local_78 + -1;
          uVar18 = 0;
          uVar19 = 2;
          bVar3 = local_78 < 2;
          local_78 = lVar15;
          if (bVar3) {
            bVar3 = false;
            goto LAB_0012b10f;
          }
        }
        goto LAB_0012abca;
      }
      uVar18 = uVar18 + 1;
      local_6c = local_6c + 1;
      cVar23 = *pcVar11;
      pcVar11 = pcVar11 + 1;
      uVar19 = 1;
      if (cVar23 != '\n') goto LAB_0012abca;
      if ((data->set).verbose == true) {
        Curl_debug(data,CURLINFO_HEADER_IN,local_a0,(long)local_6c,conn);
      }
      len = (size_t)local_6c;
      if (((data->set).suppress_connect_headers != true) &&
         (CVar7 = Curl_client_write(conn,(data->set).include_header | 2,local_a0,len),
         CVar7 != CURLE_OK)) goto LAB_0012b24e;
      plVar2 = &(data->info).header_size;
      *plVar2 = *plVar2 + len;
      plVar2 = &(data->req).headerbytecount;
      *plVar2 = *plVar2 + len;
      if ((*local_a0 == '\r') || (*local_a0 == '\n')) {
        pcVar11 = conn->connect_buffer;
        uVar19 = 0;
        if (*piVar1 == 0x197) {
          if ((data->state).authproblem == false) {
            if (local_78 != 0) {
              Curl_infof(data,"Ignore %ld bytes of response-body\n",local_78);
              uVar19 = 2;
              goto LAB_0012ae05;
            }
            if ((local_58 & 1) != 0) {
              Curl_infof(data,"Ignore chunked response-body\n");
              (data->req).ignorebody = true;
              if (local_a0[1] == '\n') {
                local_a0 = local_a0 + 1;
              }
              CVar10 = Curl_httpchunk_read(conn,local_a0 + 1,1,&gotbytes);
              if (CVar10 != CHUNKE_STOP) {
                uVar19 = 2;
                goto LAB_0012ae05;
              }
              Curl_infof(data,"chunk reading DONE\n");
            }
          }
          uVar19 = 0;
        }
LAB_0012ae05:
        conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
        uVar18 = 0;
        goto LAB_0012abca;
      }
      local_a0[len] = '\0';
      iVar9 = curl_strnequal("WWW-Authenticate:",local_a0,0x11);
      bVar3 = bVar22;
      if ((iVar9 == 0) || (*piVar1 != 0x191)) {
        iVar9 = curl_strnequal("Proxy-authenticate:",local_a0,0x13);
        if ((iVar9 == 0) || (_Var5 = true, *piVar1 != 0x197)) {
          iVar9 = curl_strnequal("Content-Length:",local_a0,0xf);
          if (iVar9 == 0) {
            _Var5 = Curl_compareheader(local_a0,"Connection:","close");
            bVar3 = true;
            if (_Var5) goto LAB_0012abab;
            iVar9 = curl_strnequal("Transfer-Encoding:",local_a0,0x12);
            if (iVar9 == 0) {
              _Var5 = Curl_compareheader(local_a0,"Proxy-Connection:","close");
              if ((!_Var5) &&
                 (iVar9 = __isoc99_sscanf(local_a0,"HTTP/1.%d %d",&subversion,piVar1),
                 bVar3 = bVar22, iVar9 == 2)) {
                (data->info).httpproxycode = (data->req).httpcode;
              }
              goto LAB_0012abab;
            }
            if (99 < *piVar1 - 200U) {
              _Var5 = Curl_compareheader(local_a0,"Transfer-Encoding:","chunked");
              bVar3 = bVar22;
              if (_Var5) {
                Curl_infof(data,"CONNECT responded chunked\n");
                Curl_httpchunk_init(conn);
                local_58 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              }
              goto LAB_0012abab;
            }
            pcVar11 = "Ignoring Transfer-Encoding in CONNECT %03d response\n";
          }
          else {
            if (99 < *piVar1 - 200U) {
              local_78 = strtol(local_a0 + 0xf,(char **)0x0,10);
              goto LAB_0012abab;
            }
            pcVar11 = "Ignoring Content-Length in CONNECT %03d response\n";
          }
          Curl_infof(data,pcVar11);
          bVar3 = bVar22;
          goto LAB_0012abab;
        }
      }
      else {
        _Var5 = false;
      }
      pcVar11 = Curl_copy_header_value(local_a0);
      if (pcVar11 == (char *)0x0) {
        CVar7 = CURLE_OUT_OF_MEMORY;
        goto LAB_0012b24e;
      }
      CVar7 = Curl_http_input_auth(conn,_Var5,pcVar11);
      (*Curl_cfree)(pcVar11);
      if (CVar7 != CURLE_OK) goto LAB_0012b24e;
    } while( true );
  }
  goto LAB_0012a890;
code_r0x0012ac48:
  if (999 < timeout_ms) {
    timeout_ms = 1000;
  }
  iVar9 = Curl_socket_check(sockfd,-1,-1,timeout_ms);
  if (iVar9 == -1) {
    pcVar11 = "Proxy CONNECT aborted due to select/poll error";
LAB_0012b100:
    Curl_failf(data,pcVar11);
    bVar3 = true;
    goto LAB_0012b10f;
  }
  goto LAB_0012abe9;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(TUNNEL_INIT == conn->tunnel_state[sockindex]) {
    if(!conn->connect_buffer) {
      conn->connect_buffer = malloc(CONNECT_BUFFER_SIZE);
      if(!conn->connect_buffer)
        return CURLE_OUT_OF_MEMORY;
    }
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || (TUNNEL_COMPLETE == conn->tunnel_state[sockindex]))
    Curl_safefree(conn->connect_buffer);

  return result;
}